

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOCBparser.c
# Opt level: O1

void docbFreeParserCtxt(docbParserCtxtPtr ctxt)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  
  if (docbFreeParserCtxt_deprecated == '\0') {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"docbFreeParserCtxt() deprecated function reached\n");
    docbFreeParserCtxt_deprecated = '\x01';
  }
  xmlFreeParserCtxt(ctxt);
  return;
}

Assistant:

void
docbFreeParserCtxt(docbParserCtxtPtr ctxt ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "docbFreeParserCtxt() deprecated function reached\n");
        deprecated = 1;
    }
    xmlFreeParserCtxt(ctxt);
}